

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_h_predictor_8x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 *puVar1;
  undefined1 (*in_RCX) [16];
  long in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i left_u16;
  undefined4 uStack_2bc;
  undefined4 uStack_2ac;
  undefined4 uStack_29c;
  undefined4 uStack_28c;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_208;
  undefined8 local_1e8;
  undefined8 local_1c8;
  undefined8 local_1a8;
  __m128i row7;
  __m128i row6;
  __m128i row5;
  __m128i row4;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  
  auVar2 = pshuflw(*in_RCX,*in_RCX,0);
  auVar3 = pshuflw(*in_RCX,*in_RCX,0x55);
  auVar4 = pshuflw(*in_RCX,*in_RCX,0xaa);
  auVar5 = pshuflw(*in_RCX,*in_RCX,0xff);
  auVar6 = pshufhw(*in_RCX,*in_RCX,0);
  auVar7 = pshufhw(*in_RCX,*in_RCX,0x55);
  auVar8 = pshufhw(*in_RCX,*in_RCX,0xaa);
  auVar9 = pshufhw(*in_RCX,*in_RCX,0xff);
  local_258 = auVar2._0_8_;
  *in_RDI = local_258;
  in_RDI[1] = local_258;
  puVar1 = (undefined8 *)((long)in_RDI + in_RSI * 2);
  local_268 = auVar3._0_8_;
  *puVar1 = local_268;
  puVar1[1] = local_268;
  puVar1 = (undefined8 *)((long)puVar1 + in_RSI * 2);
  local_278 = auVar4._0_8_;
  *puVar1 = local_278;
  puVar1[1] = local_278;
  puVar1 = (undefined8 *)((long)puVar1 + in_RSI * 2);
  local_288 = auVar5._0_8_;
  *puVar1 = local_288;
  puVar1[1] = local_288;
  puVar1 = (undefined8 *)((long)puVar1 + in_RSI * 2);
  uStack_28c = auVar6._12_4_;
  *puVar1 = local_1a8;
  puVar1[1] = CONCAT44(uStack_28c,(undefined4)row1[0]);
  puVar1 = (undefined8 *)((long)puVar1 + in_RSI * 2);
  uStack_29c = auVar7._12_4_;
  *puVar1 = local_1c8;
  puVar1[1] = CONCAT44(uStack_29c,(undefined4)row3[0]);
  puVar1 = (undefined8 *)((long)puVar1 + in_RSI * 2);
  uStack_2ac = auVar8._12_4_;
  *puVar1 = local_1e8;
  puVar1[1] = CONCAT44(uStack_2ac,(undefined4)row5[0]);
  puVar1 = (undefined8 *)((long)puVar1 + in_RSI * 2);
  uStack_2bc = auVar9._12_4_;
  *puVar1 = local_208;
  puVar1[1] = CONCAT44(uStack_2bc,(undefined4)row7[0]);
  return;
}

Assistant:

void aom_highbd_h_predictor_8x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  const __m128i left_u16 = _mm_load_si128((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  const __m128i row4 = _mm_shufflehi_epi16(left_u16, 0x0);
  const __m128i row5 = _mm_shufflehi_epi16(left_u16, 0x55);
  const __m128i row6 = _mm_shufflehi_epi16(left_u16, 0xaa);
  const __m128i row7 = _mm_shufflehi_epi16(left_u16, 0xff);
  (void)above;
  (void)bd;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row0, row0));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row1, row1));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row2, row2));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpacklo_epi64(row3, row3));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row4, row4));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row5, row5));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row6, row6));
  dst += stride;
  _mm_store_si128((__m128i *)dst, _mm_unpackhi_epi64(row7, row7));
}